

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_test.cpp
# Opt level: O1

XrResult LayerTestXrDestroyInstance(XrInstance instance)

{
  XrResult XVar1;
  mapped_type *pp_Var2;
  XrInstance_T *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<XrInstance_T_*const,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)())>_>,_std::_Rb_tree_iterator<std::pair<XrInstance_T_*const,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)())>_>_>
  pVar3;
  PFN_xrVoidFunction nextDestroyInstance;
  XrInstance_T *local_20;
  _func_void *local_18;
  
  local_18 = (_func_void *)0x0;
  local_20 = in_RDI;
  pp_Var2 = std::
            map<XrInstance_T_*,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)()),_std::less<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)())>_>_>
            ::operator[](&g_next_gipa_map,&local_20);
  XVar1 = (**pp_Var2)(local_20,"xrDestroyInstance",&local_18);
  if (XR_ERROR_VALIDATION_FAILURE < XVar1) {
    XVar1 = (*local_18)(local_20);
  }
  if (XR_ERROR_VALIDATION_FAILURE < XVar1) {
    pVar3 = std::
            _Rb_tree<XrInstance_T_*,_std::pair<XrInstance_T_*const,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)())>,_std::_Select1st<std::pair<XrInstance_T_*const,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)())>_>,_std::less<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)())>_>_>
            ::equal_range(&g_next_gipa_map._M_t,&local_20);
    std::
    _Rb_tree<XrInstance_T_*,_std::pair<XrInstance_T_*const,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)())>,_std::_Select1st<std::pair<XrInstance_T_*const,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)())>_>,_std::less<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)())>_>_>
    ::_M_erase_aux(&g_next_gipa_map._M_t,(_Base_ptr)pVar3.first._M_node,
                   (_Base_ptr)pVar3.second._M_node);
  }
  return XVar1;
}

Assistant:

static XRAPI_ATTR XrResult XRAPI_CALL LayerTestXrDestroyInstance(XrInstance instance) {
    // Call down to the next xrDestroyInstance.
    PFN_xrVoidFunction nextDestroyInstance{nullptr};
    XrResult res = g_next_gipa_map[instance](instance, "xrDestroyInstance", &nextDestroyInstance);
    if (XR_SUCCEEDED(res)) {
        res = reinterpret_cast<PFN_xrDestroyInstance>(nextDestroyInstance)(instance);
    }

    if (XR_SUCCEEDED(res)) {
        g_next_gipa_map.erase(instance);
    }

    return res;
}